

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O0

void vocidel(voccxdef *ctx,objnum obj)

{
  vocidef *pvVar1;
  vocidef *v;
  objnum obj_local;
  voccxdef *ctx_local;
  
  pvVar1 = ctx->voccxinh[(int)(uint)obj >> 8][(int)(obj & 0xff)];
  ctx->voccxinh[(int)(uint)obj >> 8][(int)(obj & 0xff)] = (vocidef *)0x0;
  if (pvVar1 != (vocidef *)0x0) {
    pvVar1->vociu = (anon_union_8_2_176b10ea_for_vociu)ctx->voccxifr;
    ctx->voccxifr = pvVar1;
  }
  return;
}

Assistant:

void vocidel(voccxdef *ctx, objnum obj)
{
    vocidef *v;
    
    /* get entry out of page table, and clear page table slot */
    v = vocinh(ctx, obj);
    vocinh(ctx, obj) = (vocidef *)0;
    
    /* link into free list */
    if (v)
    {
        v->vocinxt = ctx->voccxifr;
        ctx->voccxifr = v;
    }
}